

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeUnsignedValueWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,BVec4 *colorMask,PixelBufferAccess *colorBuffer)

{
  ulong uVar1;
  int iVar2;
  int y;
  Vector<unsigned_int,_4> *trueVal;
  ulong uVar3;
  UVec4 originalValue;
  UVec4 local_50;
  Vector<unsigned_int,_4> local_40;
  
  trueVal = &this->m_sampleRegister[0].unsignedValue;
  for (uVar3 = 0; uVar3 != 0x40; uVar3 = uVar3 + 1) {
    if (*(char *)((long)(trueVal + -8) + 0xc) == '\x01') {
      uVar1 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
      y = (int)((long)uVar1 % (long)numSamplesPerFragment);
      iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
      tcu::ConstPixelBufferAccess::getPixelUint
                ((ConstPixelBufferAccess *)&local_40,(int)colorBuffer,y,
                 inputFragments[iVar2].pixelCoord.m_data[0]);
      tcu::select<unsigned_int,4>((tcu *)&local_50,trueVal,&local_40,colorMask);
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,&local_50,y,inputFragments[iVar2].pixelCoord.m_data[0],
                 inputFragments[iVar2].pixelCoord.m_data[1]);
    }
    trueVal = (Vector<unsigned_int,_4> *)((long)(trueVal + 8) + 4);
  }
  return;
}

Assistant:

void FragmentProcessor::executeUnsignedValueWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const tcu::BVec4& colorMask, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			const UVec4			originalValue	= colorBuffer.getPixelUint(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());

			colorBuffer.setPixel(tcu::select(m_sampleRegister[regSampleNdx].unsignedValue, originalValue, colorMask), fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}